

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall
Fl_Text_Buffer::redisplay_selection
          (Fl_Text_Buffer *this,Fl_Text_Selection *oldSelection,Fl_Text_Selection *newSelection)

{
  int i1;
  int i2;
  int pos;
  int iVar1;
  int iVar2;
  int iVar3;
  int ch2End;
  int ch2Start;
  int ch1End;
  int ch1Start;
  int newEnd;
  int newStart;
  int oldEnd;
  int oldStart;
  Fl_Text_Selection *newSelection_local;
  Fl_Text_Selection *oldSelection_local;
  Fl_Text_Buffer *this_local;
  
  iVar2 = oldSelection->mStart;
  iVar3 = newSelection->mStart;
  i1 = oldSelection->mEnd;
  i2 = newSelection->mEnd;
  if (((oldSelection->mSelected & 1U) != 0) || ((newSelection->mSelected & 1U) != 0)) {
    if ((oldSelection->mSelected & 1U) == 0) {
      call_modify_callbacks(this,iVar3,0,0,i2 - iVar3,(char *)0x0);
    }
    else if ((newSelection->mSelected & 1U) == 0) {
      call_modify_callbacks(this,iVar2,0,0,i1 - iVar2,(char *)0x0);
    }
    else if ((i1 < iVar3) || (i2 < iVar2)) {
      call_modify_callbacks(this,iVar2,0,0,i1 - iVar2,(char *)0x0);
      call_modify_callbacks(this,iVar3,0,0,i2 - iVar3,(char *)0x0);
    }
    else {
      pos = min(iVar2,iVar3);
      iVar1 = max(i1,i2);
      iVar2 = max(iVar2,iVar3);
      iVar3 = min(i1,i2);
      if (pos != iVar2) {
        call_modify_callbacks(this,pos,0,0,iVar2 - pos,(char *)0x0);
      }
      if (iVar3 != iVar1) {
        call_modify_callbacks(this,iVar3,0,0,iVar1 - iVar3,(char *)0x0);
      }
    }
  }
  return;
}

Assistant:

void Fl_Text_Buffer::redisplay_selection(Fl_Text_Selection *
					   oldSelection,
					   Fl_Text_Selection *
					   newSelection) const
{
  int oldStart, oldEnd, newStart, newEnd, ch1Start, ch1End, ch2Start,
  ch2End;
  
  /* If either selection is rectangular, add an additional character to
   the end of the selection to request the redraw routines to wipe out
   the parts of the selection beyond the end of the line */
  oldStart = oldSelection->mStart;
  newStart = newSelection->mStart;
  oldEnd = oldSelection->mEnd;
  newEnd = newSelection->mEnd;
  
  /* If the old or new selection is unselected, just redisplay the
   single area that is (was) selected and return */
  if (!oldSelection->mSelected && !newSelection->mSelected)
    return;
  if (!oldSelection->mSelected)
  {
    call_modify_callbacks(newStart, 0, 0, newEnd - newStart, NULL);
    return;
  }
  if (!newSelection->mSelected) {
    call_modify_callbacks(oldStart, 0, 0, oldEnd - oldStart, NULL);
    return;
  }
  
  /* If the selections are non-contiguous, do two separate updates
   and return */
  if (oldEnd < newStart || newEnd < oldStart) {
    call_modify_callbacks(oldStart, 0, 0, oldEnd - oldStart, NULL);
    call_modify_callbacks(newStart, 0, 0, newEnd - newStart, NULL);
    return;
  }
  
  /* Otherwise, separate into 3 separate regions: ch1, and ch2 (the two
   changed areas), and the unchanged area of their intersection,
   and update only the changed area(s) */
  ch1Start = min(oldStart, newStart);
  ch2End = max(oldEnd, newEnd);
  ch1End = max(oldStart, newStart);
  ch2Start = min(oldEnd, newEnd);
  if (ch1Start != ch1End)
    call_modify_callbacks(ch1Start, 0, 0, ch1End - ch1Start, NULL);
  if (ch2Start != ch2End)
    call_modify_callbacks(ch2Start, 0, 0, ch2End - ch2Start, NULL);
}